

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

bool checkInterfacePropertyCompatibility<bool>
               (cmTarget *tgt,string *p,string *config,char *defaultValue,CompatibleType t,
               bool *param_6)

{
  _Rb_tree_header *p_Var1;
  string *psVar2;
  cmTarget *this;
  char *pcVar3;
  bool value;
  bool bVar4;
  bool value_00;
  iterator iVar5;
  iterator iVar6;
  ostream *poVar7;
  bool bVar8;
  pointer ppcVar9;
  string *psVar10;
  bool bVar11;
  string report;
  string reportEntry;
  string interfaceProperty;
  ostringstream e;
  string local_240;
  vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_> *local_220;
  char *local_218 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  char *local_1d8;
  pointer local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostream local_1a8;
  
  value = cmTarget::GetPropertyAsBool(tgt,p);
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                  *)tgt,p);
  p_Var1 = &(tgt->Properties).
            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  bVar11 = (_Rb_tree_header *)iVar5._M_node != p_Var1;
  bVar4 = cmTarget::IsNullImpliedByLinkLibraries(tgt,p);
  if (bVar11 && bVar4) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmTarget.cxx"
                  ,0x1314,
                  "PropertyType checkInterfacePropertyCompatibility(const cmTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = bool]"
                 );
  }
  local_220 = cmTarget::GetLinkImplementationClosure(tgt,config);
  if ((local_220->super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (local_220->super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    local_1d8 = defaultValue;
    std::__cxx11::string::string((string *)&local_240," * Target \"",(allocator *)&local_1a8);
    psVar2 = &tgt->Name;
    std::__cxx11::string::append((string *)&local_240);
    if ((_Rb_tree_header *)iVar5._M_node != p_Var1) {
      std::__cxx11::string::append((char *)&local_240);
      valueAsString<bool>((string *)&local_1a8,value);
      std::__cxx11::string::append((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_1a8);
    }
    std::__cxx11::string::append((char *)&local_240);
    std::operator+(&local_1c8,"INTERFACE_",p);
    ppcVar9 = (local_220->super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    while (ppcVar9 !=
           (local_220->super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>).
           _M_impl.super__Vector_impl_data._M_finish) {
      this = *ppcVar9;
      local_1d0 = ppcVar9;
      iVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                      *)this,&local_1c8);
      value_00 = cmTarget::GetPropertyAsBool(this,&local_1c8);
      local_1f8._M_string_length = 0;
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      local_1f8.field_2._M_local_buf[0] = '\0';
      bVar8 = value;
      if ((_Rb_tree_header *)iVar6._M_node ==
          &(this->Properties).
           super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
           ._M_t._M_impl.super__Rb_tree_header) {
        if (bVar4) {
          bVar8 = false;
        }
        if ((_Rb_tree_header *)iVar5._M_node != p_Var1) {
          bVar8 = value;
        }
      }
      else {
        std::__cxx11::string::append((char *)&local_1f8);
        psVar10 = &this->Name;
        std::__cxx11::string::append((string *)&local_1f8);
        std::__cxx11::string::append((char *)&local_1f8);
        valueAsString<bool>((string *)&local_1a8,value_00);
        std::__cxx11::string::append((string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_1a8);
        std::__cxx11::string::append((char *)&local_1f8);
        if ((_Rb_tree_header *)iVar5._M_node == p_Var1) {
          if (bVar4) {
            std::__cxx11::string::append((string *)&local_240);
            compatibilityAgree_abi_cxx11_((string *)&local_1a8,t,false);
            std::__cxx11::string::append((string *)&local_240);
            std::__cxx11::string::~string((string *)&local_1a8);
            if (value_00) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
              poVar7 = std::operator<<(&local_1a8,"Property ");
              pcVar3 = local_1d8;
              poVar7 = std::operator<<(poVar7,(string *)p);
              poVar7 = std::operator<<(poVar7," on target \"");
              poVar7 = std::operator<<(poVar7,(string *)psVar2);
              poVar7 = std::operator<<(poVar7,"\" is\nimplied to be ");
              poVar7 = std::operator<<(poVar7,pcVar3);
              poVar7 = std::operator<<(poVar7,
                                       " because it was used to determine the link libraries\nalready. The INTERFACE_"
                                      );
              poVar7 = std::operator<<(poVar7,(string *)p);
              poVar7 = std::operator<<(poVar7," property on\ndependency \"");
              poVar7 = std::operator<<(poVar7,(string *)psVar10);
              std::operator<<(poVar7,"\" is in conflict.\n");
              std::__cxx11::stringbuf::str();
              cmSystemTools::Error(local_218[0],(char *)0x0,(char *)0x0,(char *)0x0);
              std::__cxx11::string::~string((string *)local_218);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
              value = false;
              goto LAB_00322366;
            }
            bVar8 = false;
          }
          else if (bVar11) {
            std::__cxx11::string::append((string *)&local_240);
            compatibilityAgree_abi_cxx11_((string *)&local_1a8,t,false);
            std::__cxx11::string::append((string *)&local_240);
            std::__cxx11::string::~string((string *)&local_1a8);
            bVar11 = true;
            if (value_00 != value) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
              poVar7 = std::operator<<(&local_1a8,"The INTERFACE_");
              poVar7 = std::operator<<(poVar7,(string *)p);
              poVar7 = std::operator<<(poVar7," property of \"");
              poVar7 = std::operator<<(poVar7,(string *)psVar10);
              poVar7 = std::operator<<(poVar7,"\" does\nnot agree with the value of ");
              poVar7 = std::operator<<(poVar7,(string *)p);
              poVar7 = std::operator<<(poVar7," already determined\nfor \"");
              poVar7 = std::operator<<(poVar7,(string *)psVar2);
              std::operator<<(poVar7,"\".\n");
              std::__cxx11::stringbuf::str();
              cmSystemTools::Error(local_218[0],(char *)0x0,(char *)0x0,(char *)0x0);
              goto LAB_0032224f;
            }
          }
          else {
            std::operator+((string *)&local_1a8,&local_1f8,"(Interface set)\n");
            std::__cxx11::string::append((string *)&local_240);
            std::__cxx11::string::~string((string *)&local_1a8);
            bVar11 = true;
            bVar8 = value_00;
          }
        }
        else {
          std::__cxx11::string::append((string *)&local_240);
          compatibilityAgree_abi_cxx11_((string *)&local_1a8,t,false);
          std::__cxx11::string::append((string *)&local_240);
          std::__cxx11::string::~string((string *)&local_1a8);
          if (value_00 != value) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
            poVar7 = std::operator<<(&local_1a8,"Property ");
            poVar7 = std::operator<<(poVar7,(string *)p);
            poVar7 = std::operator<<(poVar7," on target \"");
            poVar7 = std::operator<<(poVar7,(string *)psVar2);
            poVar7 = std::operator<<(poVar7,"\" does\nnot match the INTERFACE_");
            poVar7 = std::operator<<(poVar7,(string *)p);
            poVar7 = std::operator<<(poVar7," property requirement\nof dependency \"");
            poVar7 = std::operator<<(poVar7,(string *)psVar10);
            std::operator<<(poVar7,"\".\n");
            std::__cxx11::stringbuf::str();
            cmSystemTools::Error(local_218[0],(char *)0x0,(char *)0x0,(char *)0x0);
LAB_0032224f:
            std::__cxx11::string::~string((string *)local_218);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
LAB_00322366:
            std::__cxx11::string::~string((string *)&local_1f8);
            break;
          }
        }
      }
      value = bVar8;
      std::__cxx11::string::~string((string *)&local_1f8);
      ppcVar9 = local_1d0 + 1;
    }
    valueAsString<bool>((string *)&local_1a8,value);
    compatibilityType_abi_cxx11_(&local_1f8,t);
    cmTarget::ReportPropertyOrigin(tgt,p,(string *)&local_1a8,&local_240,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_240);
  }
  return value;
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmTarget const* tgt,
                                          const std::string &p,
                                          const std::string& config,
                                          const char *defaultValue,
                                          CompatibleType t,
                                          PropertyType *)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);
  const bool explicitlySet = tgt->GetProperties()
                                  .find(p)
                                  != tgt->GetProperties().end();
  const bool impliedByUse =
          tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet)
      || (!impliedByUse && !explicitlySet));

  std::vector<cmTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if(deps.empty())
    {
    return propContent;
    }
  bool propInitialized = explicitlySet;

  std::string report = " * Target \"";
  report += tgt->GetName();
  if (explicitlySet)
    {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
    }
  else if (impliedByUse)
    {
    report += "\" property is implied by use.\n";
    }
  else
    {
    report += "\" property not set.\n";
    }

  std::string interfaceProperty = "INTERFACE_" + p;
  for(std::vector<cmTarget const*>::const_iterator li =
      deps.begin();
      li != deps.end(); ++li)
    {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    cmTarget const* theTarget = *li;

    const bool ifaceIsSet = theTarget->GetProperties()
                            .find(interfaceProperty)
                            != theTarget->GetProperties().end();
    PropertyType ifacePropContent =
                    getTypedProperty<PropertyType>(theTarget,
                              interfaceProperty);

    std::string reportEntry;
    if (ifaceIsSet)
      {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
      }

    if (explicitlySet)
      {
      if (ifaceIsSet)
        {
        std::pair<bool, PropertyType> consistent =
                                  consistentProperty(propContent,
                                                     ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first)
          {
          std::ostringstream e;
          e << "Property " << p << " on target \""
            << tgt->GetName() << "\" does\nnot match the "
            "INTERFACE_" << p << " property requirement\nof "
            "dependency \"" << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str().c_str());
          break;
          }
        else
          {
          propContent = consistent.second;
          continue;
          }
        }
      else
        {
        // Explicitly set on target and not set in iface. Can't disagree.
        continue;
        }
      }
    else if (impliedByUse)
      {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet)
        {
        std::pair<bool, PropertyType> consistent =
                                  consistentProperty(propContent,
                                                     ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first)
          {
          std::ostringstream e;
          e << "Property " << p << " on target \""
            << tgt->GetName() << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_" << p << " property on\ndependency \""
            << theTarget->GetName() << "\" is in conflict.\n";
          cmSystemTools::Error(e.str().c_str());
          break;
          }
        else
          {
          propContent = consistent.second;
          continue;
          }
        }
      else
        {
        // Implicitly set on target and not set in iface. Can't disagree.
        continue;
        }
      }
    else
      {
      if (ifaceIsSet)
        {
        if (propInitialized)
          {
          std::pair<bool, PropertyType> consistent =
                                    consistentProperty(propContent,
                                                       ifacePropContent, t);
          report += reportEntry;
          report += compatibilityAgree(t, propContent != consistent.second);
          if (!consistent.first)
            {
            std::ostringstream e;
            e << "The INTERFACE_" << p << " property of \""
              << theTarget->GetName() << "\" does\nnot agree with the value "
                "of " << p << " already determined\nfor \""
              << tgt->GetName() << "\".\n";
            cmSystemTools::Error(e.str().c_str());
            break;
            }
          else
            {
            propContent = consistent.second;
            continue;
            }
          }
        else
          {
          report += reportEntry + "(Interface set)\n";
          propContent = ifacePropContent;
          propInitialized = true;
          }
        }
      else
        {
        // Not set. Nothing to agree on.
        continue;
        }
      }
    }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}